

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::BasicFormatter<char,_fmt::ArgFormatter<char>_>::format
          (BasicFormatter<char,_fmt::ArgFormatter<char>_> *this,BasicCStringRef<char> format_str)

{
  byte bVar1;
  FormatError *this_00;
  BasicCStringRef<char> start;
  Char *s;
  Arg arg;
  byte *local_40;
  Arg local_38;
  
  start.data_ = format_str.data_;
  local_40 = (byte *)format_str.data_;
  if (*format_str.data_ != '\0') {
    do {
      local_40 = (byte *)format_str.data_ + 1;
      bVar1 = *format_str.data_;
      if ((bVar1 == 0x7d) || (bVar1 == 0x7b)) {
        if (*local_40 == bVar1) {
          internal::FormatterBase::write<char>
                    (&this->super_FormatterBase,this->writer_,start.data_,(char *)local_40);
          start.data_ = (char *)(local_40 + 1);
          local_40 = (byte *)start.data_;
        }
        else {
          if (bVar1 == 0x7d) {
            this_00 = (FormatError *)__cxa_allocate_exception(0x10);
            FormatError::FormatError(this_00,(CStringRef)0x11c481);
            __cxa_throw(this_00,&FormatError::typeinfo,std::runtime_error::~runtime_error);
          }
          internal::FormatterBase::write<char>
                    (&this->super_FormatterBase,this->writer_,start.data_,format_str.data_);
          if ((*local_40 == 0x5f) || ((byte)((*local_40 & 0xdf) + 0xbf) < 0x1a)) {
            parse_arg_name(&local_38,this,(Char **)&local_40);
          }
          else {
            parse_arg_index(&local_38,this,(Char **)&local_40);
          }
          start.data_ = format(this,(Char **)&local_40,&local_38);
          local_40 = (byte *)start.data_;
        }
      }
      format_str.data_ = (char *)local_40;
    } while (*local_40 != 0);
  }
  internal::FormatterBase::write<char>
            (&this->super_FormatterBase,this->writer_,start.data_,(char *)local_40);
  return;
}

Assistant:

void BasicFormatter<Char, AF>::format(BasicCStringRef<Char> format_str)
{
    const Char *s = format_str.c_str();
    const Char *start = s;
    while (*s)
    {
        Char c = *s++;
        if (c != '{' && c != '}')
            continue;
        if (*s == c)
        {
            write(writer_, start, s);
            start = ++s;
            continue;
        }
        if (c == '}')
            FMT_THROW(FormatError("unmatched '}' in format string"));
        write(writer_, start, s - 1);
        internal::Arg arg = internal::is_name_start(*s) ? parse_arg_name(s) : parse_arg_index(s);
        start = s = format(s, arg);
    }
    write(writer_, start, s);
}